

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::psbtbumpfee(void)

{
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  allocator<char> local_29;
  _Alloc_hider in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             (allocator<char> *)in_stack_ffffffffffffffd8._M_p);
  bumpfee_helper(in_RDI,(string *)&stack0xffffffffffffffd8);
  std::__cxx11::string::~string(in_stack_ffffffffffffff98);
  std::allocator<char>::~allocator(&local_29);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan psbtbumpfee() { return bumpfee_helper("psbtbumpfee"); }